

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O1

int mk_http_range_parse(mk_http_request *sr)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint pos_end;
  long lVar5;
  char *pcVar6;
  
  pcVar6 = (sr->range).data;
  if (pcVar6 == (char *)0x0) {
    return -1;
  }
  uVar3 = mk_string_char_search(pcVar6,0x3d,(int)(sr->range).len);
  if ((int)uVar3 < 0) {
    return -1;
  }
  pcVar6 = (sr->range).data;
  iVar4 = strncasecmp(pcVar6,"Bytes",(ulong)uVar3);
  if (iVar4 != 0) {
    return -1;
  }
  pos_end = mk_string_char_search(pcVar6,0x2d,(int)(sr->range).len);
  if ((int)pos_end < 0) {
    return -1;
  }
  uVar3 = uVar3 + 1;
  if (uVar3 == pos_end) {
    (sr->headers).ranges[0] = -1;
    lVar5 = atol((sr->range).data + (ulong)pos_end + 1);
    uVar3 = (uint)lVar5;
    (sr->headers).ranges[1] = uVar3;
    if ((int)uVar3 < 1) {
      return -1;
    }
    uVar3 = uVar3 & 0x7fffffff;
  }
  else {
    iVar2 = (int)(sr->range).len;
    iVar4 = pos_end + 1;
    if (iVar2 <= iVar4) {
      if (uVar3 == pos_end) {
        return -1;
      }
      if (iVar4 == iVar2) {
        pcVar6 = mk_string_copy_substr((sr->range).data,uVar3,iVar2);
        lVar5 = atol(pcVar6);
        (sr->headers).ranges[0] = (int)lVar5;
        free(pcVar6);
        plVar1 = &(sr->headers).content_length;
        *plVar1 = *plVar1 - (long)(sr->headers).ranges[0];
        return 0;
      }
      return -1;
    }
    pcVar6 = mk_string_copy_substr((sr->range).data,uVar3,pos_end);
    lVar5 = atol(pcVar6);
    (sr->headers).ranges[0] = (int)lVar5;
    free(pcVar6);
    pcVar6 = mk_string_copy_substr((sr->range).data,iVar4,iVar2);
    lVar5 = atol(pcVar6);
    (sr->headers).ranges[1] = (int)lVar5;
    free(pcVar6);
    iVar4 = (sr->headers).ranges[1];
    if (iVar4 < 0) {
      return -1;
    }
    iVar2 = (sr->headers).ranges[0];
    if (iVar4 < iVar2) {
      return -1;
    }
    uVar3 = (iVar4 - iVar2) + 1;
  }
  (sr->headers).content_length = (ulong)uVar3;
  return 0;
}

Assistant:

static int mk_http_range_parse(struct mk_http_request *sr)
{
    int eq_pos, sep_pos, len;
    char *buffer = 0;
    struct response_headers *sh;

    if (!sr->range.data)
        return -1;

    if ((eq_pos = mk_string_char_search(sr->range.data, '=', sr->range.len)) < 0)
        return -1;

    if (strncasecmp(sr->range.data, "Bytes", eq_pos) != 0)
        return -1;

    if ((sep_pos = mk_string_char_search(sr->range.data, '-', sr->range.len)) < 0)
        return -1;

    len = sr->range.len;
    sh = &sr->headers;

    /* =-xxx */
    if (eq_pos + 1 == sep_pos) {
        sh->ranges[0] = -1;
        sh->ranges[1] = (unsigned long) atol(sr->range.data + sep_pos + 1);

        if (sh->ranges[1] <= 0) {
            return -1;
        }

        sh->content_length = sh->ranges[1];
        return 0;
    }

    /* =yyy-xxx */
    if ((eq_pos + 1 != sep_pos) && (len > sep_pos + 1)) {
        buffer = mk_string_copy_substr(sr->range.data, eq_pos + 1, sep_pos);
        sh->ranges[0] = (unsigned long) atol(buffer);
        mk_mem_free(buffer);

        buffer = mk_string_copy_substr(sr->range.data, sep_pos + 1, len);
        sh->ranges[1] = (unsigned long) atol(buffer);
        mk_mem_free(buffer);

        if (sh->ranges[1] < 0 || (sh->ranges[0] > sh->ranges[1])) {
            return -1;
        }

        sh->content_length = abs(sh->ranges[1] - sh->ranges[0]) + 1;
        return 0;
    }
    /* =yyy- */
    if ((eq_pos + 1 != sep_pos) && (len == sep_pos + 1)) {
        buffer = mk_string_copy_substr(sr->range.data, eq_pos + 1, len);
        sr->headers.ranges[0] = (unsigned long) atol(buffer);
        mk_mem_free(buffer);

        sh->content_length = (sh->content_length - sh->ranges[0]);
        return 0;
    }

    return -1;
}